

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

TokenOrSyntax * __thiscall
slang::syntax::NamedStructurePatternMemberSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,NamedStructurePatternMemberSyntax *this,
          size_t index)

{
  Token local_20;
  
  if (index == 2) {
    *(PatternSyntax **)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         (this->pattern).ptr;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10
     ) = '\x01';
  }
  else {
    if (index == 1) {
      local_20.kind = (this->colon).kind;
      local_20._2_1_ = (this->colon).field_0x2;
      local_20.numFlags.raw = (this->colon).numFlags.raw;
      local_20.rawLen = (this->colon).rawLen;
      local_20.info._0_4_ = *(undefined4 *)&(this->colon).info;
      local_20.info._4_4_ = *(undefined4 *)((long)&(this->colon).info + 4);
    }
    else if (index == 0) {
      local_20.kind = (this->name).kind;
      local_20._2_1_ = (this->name).field_0x2;
      local_20.numFlags.raw = (this->name).numFlags.raw;
      local_20.rawLen = (this->name).rawLen;
      local_20.info._0_4_ = *(undefined4 *)&(this->name).info;
      local_20.info._4_4_ = *(undefined4 *)((long)&(this->name).info + 4);
    }
    else {
      parsing::Token::Token(&local_20);
    }
    *(undefined4 *)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         local_20._0_4_;
    *(uint32_t *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 4) =
         local_20.rawLen;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 8) =
         local_20.info._0_4_;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0xc)
         = local_20.info._4_4_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10
     ) = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax NamedStructurePatternMemberSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return name;
        case 1: return colon;
        case 2: return pattern.get();
        default: return nullptr;
    }
}